

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

GPU_Target * GPU_Init(Uint16 w,Uint16 h,GPU_WindowFlagEnum SDL_flags)

{
  undefined4 uVar1;
  undefined4 uVar2;
  GPU_RendererID renderer_request;
  _Bool _Var3;
  long lVar4;
  GPU_Target *pGVar5;
  GPU_Target *screen;
  GPU_RendererID renderer_order [10];
  int local_20;
  uint local_1c;
  int i;
  int renderer_order_size;
  GPU_WindowFlagEnum SDL_flags_local;
  Uint16 h_local;
  Uint16 w_local;
  
  i = SDL_flags;
  renderer_order_size._0_2_ = h;
  renderer_order_size._2_2_ = w;
  gpu_init_error_queue();
  gpu_init_renderer_register();
  _Var3 = gpu_init_SDL();
  if (_Var3) {
    local_1c = 0;
    GPU_GetRendererOrder((int *)&local_1c,(GPU_RendererID *)&screen);
    for (local_20 = 0; local_20 < (int)local_1c; local_20 = local_20 + 1) {
      lVar4 = (long)local_20;
      uVar1 = renderer_order[lVar4].renderer;
      uVar2 = renderer_order[lVar4].major_version;
      renderer_request._20_4_ = uVar2;
      renderer_request.minor_version = uVar1;
      renderer_request._8_8_ = renderer_order[lVar4].name;
      renderer_request.name = (char *)*(undefined8 *)&renderer_order[lVar4 + -1].minor_version;
      pGVar5 = GPU_InitRendererByID
                         (renderer_request,renderer_order_size._2_2_,(Uint16)renderer_order_size,i);
      if (pGVar5 != (GPU_Target *)0x0) {
        return pGVar5;
      }
    }
    GPU_PushErrorCode("GPU_Init",GPU_ERROR_BACKEND_ERROR,
                      "No renderer out of %d was able to initialize properly",(ulong)local_1c);
  }
  return (GPU_Target *)0x0;
}

Assistant:

GPU_Target* GPU_Init(Uint16 w, Uint16 h, GPU_WindowFlagEnum SDL_flags)
{
    int renderer_order_size;
    int i;
    GPU_RendererID renderer_order[GPU_RENDERER_ORDER_MAX];

    gpu_init_error_queue();

    gpu_init_renderer_register();

    if(!gpu_init_SDL())
        return NULL;

    renderer_order_size = 0;
    GPU_GetRendererOrder(&renderer_order_size, renderer_order);

    // Init the renderers in order
    for(i = 0; i < renderer_order_size; i++)
    {
        GPU_Target* screen = GPU_InitRendererByID(renderer_order[i], w, h, SDL_flags);
        if(screen != NULL)
            return screen;
    }

    GPU_PushErrorCode("GPU_Init", GPU_ERROR_BACKEND_ERROR, "No renderer out of %d was able to initialize properly", renderer_order_size);
    return NULL;
}